

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void __thiscall MetaSim::Event::Event(Event *this,Event *e)

{
  _Elt_pointer puVar1;
  ParticleInterface *pPVar2;
  int iVar3;
  _Elt_pointer puVar4;
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_> *p;
  _Elt_pointer puVar5;
  _Map_pointer ppuVar6;
  
  this->_vptr_Event = (_func_int **)&PTR__Event_0017dc90;
  this->_order = 0;
  this->_isInQueue = false;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_particles).
  super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ::_M_initialize_map(&(this->_particles).
                       super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                      ,0);
  (this->_time).v = 0x7fffffffffffffff;
  (this->_lastTime).v = 0x7fffffffffffffff;
  iVar3 = e->_std_priority;
  this->_priority = e->_priority;
  this->_std_priority = iVar3;
  this->_disposable = e->_disposable;
  puVar5 = (e->_particles).
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar1 = (e->_particles).
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar5 != puVar1) {
    puVar4 = (e->_particles).
             super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar6 = (e->_particles).
              super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pPVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
               .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl;
      (*pPVar2->_vptr_ParticleInterface[3])(pPVar2,this);
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar4) {
        puVar5 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        puVar4 = puVar5 + 0x40;
      }
    } while (puVar5 != puVar1);
  }
  return;
}

Assistant:

Event::Event(const Event &e) :
        _order(0),
        _isInQueue(false),
        _particles(),
        _time(MAXTICK),
        _lastTime(MAXTICK),
        _priority(e._priority),
        _std_priority(e._std_priority),
        _disposable(e._disposable)
    {
        for (auto &p : e._particles) 
            p->clone_to(*this);
    }